

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::CordOutputStreamTest_Empty_Test::TestBody
          (CordOutputStreamTest_Empty_Test *this)

{
  ulong uVar1;
  pointer *__ptr_2;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  CordOutputStream output;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  AssertHelper local_80;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  internal local_58 [8];
  undefined1 local_50 [16];
  Cord local_40 [2];
  byte local_20;
  undefined7 uStack_1f;
  
  CordOutputStream::CordOutputStream((CordOutputStream *)(local_50 + 8),0);
  CordOutputStream::Consume((CordOutputStream *)local_78);
  if (((long)(char)local_78[0] & 1U) == 0) {
    uVar1 = (ulong)(long)(char)local_78[0] >> 1;
  }
  else {
    uVar1 = *(ulong *)local_78._8_8_;
  }
  local_58[0] = (internal)(uVar1 == 0);
  local_50._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  absl::lts_20250127::Cord::~Cord((Cord *)local_78);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,local_58,(AssertionResult *)"output.Consume().empty()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x3e2,(char *)CONCAT71(local_78._1_7_,local_78[0]));
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_78._1_7_,local_78[0]) != &local_68) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_78._1_7_,local_78[0]),
                      (ulong)(local_68._M_allocated_capacity + 1));
    }
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._0_8_
                );
  }
  if ((local_20 & 1) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete((CordRep *)CONCAT71(uStack_1f,local_20));
  }
  absl::lts_20250127::Cord::~Cord(local_40);
  return;
}

Assistant:

TEST(CordOutputStreamTest, Empty) {
  CordOutputStream output;
  EXPECT_TRUE(output.Consume().empty());
}